

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-dda-dump.cpp
# Opt level: O3

void Dumper::dumpBBlockEdges(RWBBlock *block)

{
  long lVar1;
  long lVar2;
  RWBBlock *pRVar3;
  
  pRVar3 = *(RWBBlock **)(block + 0x38);
  if (pRVar3 != block + 0x38) {
    lVar2 = 0;
    do {
      lVar1 = *(long *)(pRVar3 + 0x10);
      if (lVar2 != 0) {
        printf("\tNODE%p->NODE%p [constraint=true]\n",lVar2,lVar1);
      }
      pRVar3 = *(RWBBlock **)pRVar3;
      lVar2 = lVar1;
    } while (pRVar3 != block + 0x38);
  }
  putchar(10);
  return;
}

Assistant:

static void dumpBBlockEdges(RWBBlock *block) {
        // dump CFG edges between nodes in one block
        RWNode *last = nullptr;
        for (RWNode *node : block->getNodes()) {
            if (last) { // successor edge
                printf("\tNODE%p->NODE%p [constraint=true]\n",
                       static_cast<void *>(last), static_cast<void *>(node));
            }
            last = node;
        }
        putchar('\n');
    }